

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void InitParameterInteraction(ArgsManager *args)

{
  pointer *ppbVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Network NVar6;
  int64_t iVar7;
  long lVar8;
  pointer net_in;
  string *psVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view logging_function_14;
  string_view logging_function_15;
  string_view logging_function_16;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view source_file_14;
  string_view source_file_15;
  string_view source_file_16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  string proxy_arg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-bind","");
  bVar3 = ArgsManager::IsArgSet(args,&proxy_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function._M_str = "InitParameterInteraction";
      logging_function._M_len = 0x18;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x2db,ALL,Info,(ConstevalFormatString<0U>)0x7e2687);
    }
  }
  proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-whitebind","");
  bVar3 = ArgsManager::IsArgSet(args,&proxy_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_00._M_str = "InitParameterInteraction";
      logging_function_00._M_len = 0x18;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_00._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,0x2df,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e26c9);
    }
  }
  proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-connect","");
  bVar4 = ArgsManager::IsArgSet(args,&proxy_arg);
  bVar3 = true;
  if (!bVar4) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-maxconnections","");
    iVar7 = ArgsManager::GetIntArg(args,&local_78,0x7d);
    bVar3 = iVar7 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-dnsseed","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_01._M_str = "InitParameterInteraction";
      logging_function_01._M_len = 0x18;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_01._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_01,source_file_01,0x2e5,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e271e);
    }
    proxy_arg._M_dataplus._M_p = (pointer)&proxy_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&proxy_arg,"-listen","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
      operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_02._M_str = "InitParameterInteraction";
      logging_function_02._M_len = 0x18;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_02._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x2e7,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e276e);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-proxy","");
  ppbVar1 = &onlynets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  onlynets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&onlynets,"");
  ArgsManager::GetArg(&proxy_arg,args,(string *)&local_98,(string *)&onlynets);
  if (onlynets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(onlynets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((onlynets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&proxy_arg,"");
  if ((iVar5 != 0) &&
     (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&proxy_arg,"0"), iVar5 != 0)) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-listen","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_03._M_str = "InitParameterInteraction";
      logging_function_03._M_len = 0x18;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_03._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,0x2ee,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e27c4);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-upnp","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_04._M_str = "InitParameterInteraction";
      logging_function_04._M_len = 0x18;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_04._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_04,source_file_04,0x2f2,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e27fc);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-natpmp","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_05._M_str = "InitParameterInteraction";
      logging_function_05._M_len = 0x18;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_05._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_05,source_file_05,0x2f4,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2832);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-discover","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_06._M_str = "InitParameterInteraction";
      logging_function_06._M_len = 0x18;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_06._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_06,source_file_06,0x2f8,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e286a);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-listen","");
  bVar3 = ArgsManager::GetBoolArg(args,(string *)&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-upnp","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_07._M_str = "InitParameterInteraction";
      logging_function_07._M_len = 0x18;
      source_file_07._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_07._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_07,source_file_07,0x2fe,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e28a4);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-natpmp","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_08._M_str = "InitParameterInteraction";
      logging_function_08._M_len = 0x18;
      source_file_08._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_08._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_08,source_file_08,0x300,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e28d9);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-discover","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_09._M_str = "InitParameterInteraction";
      logging_function_09._M_len = 0x18;
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_09._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_09,source_file_09,0x303,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2910);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-listenonion","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_10._M_str = "InitParameterInteraction";
      logging_function_10._M_len = 0x18;
      source_file_10._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_10._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_10,source_file_10,0x305,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2949);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-i2pacceptincoming","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_11._M_str = "InitParameterInteraction";
      logging_function_11._M_len = 0x18;
      source_file_11._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_11._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_11,source_file_11,0x307,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2985);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-externalip","");
  bVar3 = ArgsManager::IsArgSet(args,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-discover","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_12._M_str = "InitParameterInteraction";
      logging_function_12._M_len = 0x18;
      source_file_12._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_12._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_12,source_file_12,0x30e,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e29d3);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-blocksonly","");
  bVar3 = ArgsManager::GetBoolArg(args,(string *)&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-whitelistrelay","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_13._M_str = "InitParameterInteraction";
      logging_function_13._M_len = 0x18;
      source_file_13._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_13._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_13,source_file_13,0x314,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2a12);
    }
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-maxmempool","");
    util::ToString<unsigned_int>((string *)&onlynets,&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    bVar3 = ArgsManager::SoftSetArg(args,(string *)&local_98,(string *)&onlynets);
    if (onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((onlynets.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_14._M_str = "InitParameterInteraction";
      logging_function_14._M_len = 0x18;
      source_file_14._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_14._M_len = 0x58;
      LogPrintFormatInternal<unsigned_int>
                (logging_function_14,source_file_14,0x317,ALL,Info,
                 (ConstevalFormatString<1U>)0x7e2a61,&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-whitelistforcerelay","");
  bVar3 = ArgsManager::GetBoolArg(args,(string *)&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-whitelistrelay","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if (bVar3) {
      logging_function_15._M_str = "InitParameterInteraction";
      logging_function_15._M_len = 0x18;
      source_file_15._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_15._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_15,source_file_15,0x31d,ALL,Info,
                 (ConstevalFormatString<0U>)0x7e2aa1);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-onlynet","");
  bVar3 = ArgsManager::IsArgSet(args,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  if (!bVar3) goto LAB_0017a3b1;
  local_98._M_allocated_capacity = (size_type)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-onlynet","");
  ArgsManager::GetArgs(&onlynets,args,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  lVar8 = (long)onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 7;
  net_in = onlynets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      NVar6 = ParseNetwork(net_in);
      psVar9 = net_in;
      if (NVar6 - NET_IPV4 < 2) goto LAB_0017a31c;
      NVar6 = ParseNetwork(net_in + 1);
      psVar9 = net_in + 1;
      if (NVar6 - NET_IPV4 < 2) goto LAB_0017a31c;
      NVar6 = ParseNetwork(net_in + 2);
      psVar9 = net_in + 2;
      if (NVar6 - NET_IPV4 < 2) goto LAB_0017a31c;
      NVar6 = ParseNetwork(net_in + 3);
      psVar9 = net_in + 3;
      if (NVar6 - NET_IPV4 < 2) goto LAB_0017a31c;
      net_in = net_in + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)net_in >> 5;
  if (lVar8 == 1) {
LAB_0017a308:
    NVar6 = ParseNetwork(net_in);
    psVar9 = net_in;
    if (1 < NVar6 - NET_IPV4) {
      psVar9 = onlynets.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar8 == 2) {
LAB_0017a2f5:
    NVar6 = ParseNetwork(net_in);
    psVar9 = net_in;
    if (1 < NVar6 - NET_IPV4) {
      net_in = net_in + 1;
      goto LAB_0017a308;
    }
  }
  else {
    psVar9 = onlynets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((lVar8 == 3) && (NVar6 = ParseNetwork(net_in), psVar9 = net_in, 1 < NVar6 - NET_IPV4)) {
      net_in = net_in + 1;
      goto LAB_0017a2f5;
    }
  }
LAB_0017a31c:
  if (psVar9 == onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-dnsseed","");
    bVar3 = ArgsManager::SoftSetBoolArg(args,(string *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  if (bVar3 != false) {
    logging_function_16._M_str = "InitParameterInteraction";
    logging_function_16._M_len = 0x18;
    source_file_16._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp";
    source_file_16._M_len = 0x58;
    LogPrintFormatInternal<>
              (logging_function_16,source_file_16,0x326,ALL,Info,(ConstevalFormatString<0U>)0x7e2af6
              );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
LAB_0017a3b1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proxy_arg._M_dataplus._M_p != &proxy_arg.field_2) {
    operator_delete(proxy_arg._M_dataplus._M_p,proxy_arg.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitParameterInteraction(ArgsManager& args)
{
    // when specifying an explicit binding address, you want to listen on it
    // even when -connect or -proxy is specified
    if (args.IsArgSet("-bind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -bind set -> setting -listen=1\n");
    }
    if (args.IsArgSet("-whitebind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -whitebind set -> setting -listen=1\n");
    }

    if (args.IsArgSet("-connect") || args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS) <= 0) {
        // when only connecting to trusted nodes, do not seed via DNS, or listen by default
        if (args.SoftSetBoolArg("-dnsseed", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n");
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n");
    }

    std::string proxy_arg = args.GetArg("-proxy", "");
    if (proxy_arg != "" && proxy_arg != "0") {
        // to protect privacy, do not listen by default if a default proxy server is specified
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -proxy set -> setting -listen=0\n");
        // to protect privacy, do not map ports when a proxy is set. The user may still specify -listen=1
        // to listen locally, so don't rely on this happening through -listen below.
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -proxy set -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -proxy set -> setting -natpmp=0\n");
        }
        // to protect privacy, do not discover addresses by default
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -proxy set -> setting -discover=0\n");
    }

    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        // do not map ports or try to retrieve public IP when not listening (pointless)
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -listen=0 -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -natpmp=0\n");
        }
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -listen=0 -> setting -discover=0\n");
        if (args.SoftSetBoolArg("-listenonion", false))
            LogInfo("parameter interaction: -listen=0 -> setting -listenonion=0\n");
        if (args.SoftSetBoolArg("-i2pacceptincoming", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n");
        }
    }

    if (args.IsArgSet("-externalip")) {
        // if an explicit public IP is specified, do not try to find others
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -externalip set -> setting -discover=0\n");
    }

    if (args.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY)) {
        // disable whitelistrelay in blocksonly mode
        if (args.SoftSetBoolArg("-whitelistrelay", false))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n");
        // Reduce default mempool size in blocksonly mode to avoid unexpected resource usage
        if (args.SoftSetArg("-maxmempool", ToString(DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB)))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -maxmempool=%d\n", DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }

    // Forcing relay from whitelisted hosts implies we will accept relays from them in the first place.
    if (args.GetBoolArg("-whitelistforcerelay", DEFAULT_WHITELISTFORCERELAY)) {
        if (args.SoftSetBoolArg("-whitelistrelay", true))
            LogInfo("parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n");
    }
    if (args.IsArgSet("-onlynet")) {
        const auto onlynets = args.GetArgs("-onlynet");
        bool clearnet_reachable = std::any_of(onlynets.begin(), onlynets.end(), [](const auto& net) {
            const auto n = ParseNetwork(net);
            return n == NET_IPV4 || n == NET_IPV6;
        });
        if (!clearnet_reachable && args.SoftSetBoolArg("-dnsseed", false)) {
            LogInfo("parameter interaction: -onlynet excludes IPv4 and IPv6 -> setting -dnsseed=0\n");
        }
    }
}